

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O2

void SDL_CDClose(SDL12_CD *cdrom)

{
  AudioCallbackWrapperData *pAVar1;
  SDL12_CD *pSVar2;
  
  pSVar2 = ValidCDDevice(cdrom);
  if (pSVar2 != (SDL12_CD *)0x0) {
    (*SDL20_LockAudio)();
    pAVar1 = audio_cbdata;
    if (audio_cbdata != (AudioCallbackWrapperData *)0x0) {
      audio_cbdata->cdrom_status = SDL12_CD_STOPPED;
      pAVar1->cdrom_opened = SDL_FALSE;
    }
    (*SDL20_UnlockAudio)();
    if (audio_cbdata != (AudioCallbackWrapperData *)0x0) {
      FreeMp3(&audio_cbdata->cdrom_mp3);
      (*SDL20_FreeAudioStream)(audio_cbdata->cdrom_stream);
      audio_cbdata->cdrom_stream = (SDL_AudioStream *)0x0;
    }
    CloseSDL2AudioDevice();
    if (pSVar2 == CDRomDevice) {
      CDRomDevice = (SDL12_CD *)0x0;
    }
    (*SDL20_free)(pSVar2);
    return;
  }
  return;
}

Assistant:

SDLCALL
SDL_CDClose(SDL12_CD *cdrom)
{
    if ((cdrom = ValidCDDevice(cdrom)) == NULL) {
        return;
    }

    SDL20_LockAudio();
    if (audio_cbdata) {
        audio_cbdata->cdrom_status = SDL12_CD_STOPPED;
        audio_cbdata->cdrom_opened = SDL_FALSE;
    }
    SDL20_UnlockAudio();

    if (audio_cbdata) {
        FreeMp3(&audio_cbdata->cdrom_mp3);
        SDL20_FreeAudioStream(audio_cbdata->cdrom_stream);
        audio_cbdata->cdrom_stream = NULL;
    }

    CloseSDL2AudioDevice();

    if (cdrom == CDRomDevice) {
        CDRomDevice = NULL;
    }
    SDL20_free(cdrom);
}